

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

uint __thiscall Js::FunctionBody::GetStartOffset(FunctionBody *this,uint statementIndex)

{
  SmallSpanSequence *this_00;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *statementMapList;
  StatementMap *pSVar1;
  uint local_28;
  int local_24;
  int index;
  int iStack_1c;
  StatementData local_18;
  StatementData data;
  
  this_00 = (this->m_sourceInfo).pSpanSequence;
  if (this_00 == (SmallSpanSequence *)0x0) {
    local_28 = statementIndex;
    statementMapList =
         (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,StatementMaps);
    pSVar1 = GetNextNonSubexpressionStatementMap<JsUtil::List<Js::FunctionBody::StatementMap*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>>
                       (statementMapList,(int *)&stack0xffffffffffffffd8);
    local_18.sourceBegin = (pSVar1->sourceSpan).begin;
  }
  else {
    local_28 = 0;
    local_24 = this_00->baseValue;
    index = 0;
    iStack_1c = 0;
    local_18.sourceBegin = 0;
    local_18.bytecodeBegin = 0;
    SmallSpanSequence::Item
              (this_00,statementIndex,(SmallSpanSequenceIter *)&stack0xffffffffffffffd8,&local_18);
  }
  return local_18.sourceBegin;
}

Assistant:

uint FunctionBody::GetStartOffset(uint statementIndex) const
    {
        uint startOffset = 0;

        const Js::FunctionBody::SourceInfo * sourceInfo = &this->m_sourceInfo;
        if (sourceInfo->pSpanSequence != nullptr)
        {
            Js::SmallSpanSequenceIter iter;
            sourceInfo->pSpanSequence->Reset(iter);
            Js::StatementData data;
            sourceInfo->pSpanSequence->Item(statementIndex, iter, data);
            startOffset = data.sourceBegin;
        }
        else
        {
            int index = statementIndex;
            Js::FunctionBody::StatementMap * statementMap = GetNextNonSubexpressionStatementMap(GetStatementMaps(), index);
            startOffset = statementMap->sourceSpan.Begin();
        }

        return startOffset;
    }